

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

char * cimg_library::cimg::filenamerand(void)

{
  int iVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  uint __seed;
  uint k;
  long lVar5;
  
  __seed = 6;
  mutex(6,1);
  srand(__seed);
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    iVar1 = rand();
    iVar2 = rand();
    iVar4 = 10;
    cVar3 = '0';
    if (iVar1 % 3 != 0) {
      iVar4 = 0x1a;
      if (iVar1 % 3 == 1) {
        cVar3 = 'a';
      }
      else {
        cVar3 = 'A';
      }
    }
    filenamerand::randomid[lVar5] = (char)(iVar2 % iVar4) + cVar3;
  }
  mutex(6,0);
  return filenamerand::randomid;
}

Assistant:

inline const char* filenamerand() {
      cimg::mutex(6);
      static char randomid[9] = { 0 };
      cimg::srand();
      for (unsigned int k = 0; k<8; ++k) {
        const int v = (int)std::rand()%3;
        randomid[k] = (char)(v==0?('0' + (std::rand()%10)):(v==1?('a' + (std::rand()%26)):('A' + (std::rand()%26))));
      }
      cimg::mutex(6,0);
      return randomid;
    }